

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# px_config.c
# Opt level: O0

int katherine_px_config_load_bmc_data(katherine_px_config_t *px_config,katherine_bmc_t *bmc)

{
  int iVar1;
  int iVar2;
  int local_34;
  int i;
  uchar *src;
  uint32_t *dest;
  int y;
  int x;
  katherine_bmc_t *bmc_local;
  katherine_px_config_t *px_config_local;
  
  memset(px_config,0,0x10000);
  for (local_34 = 0; local_34 < 0x10000; local_34 = local_34 + 1) {
    iVar1 = 0xff - local_34 / 0x100;
    iVar2 = (local_34 % 0x100) * 0x40 + (iVar1 >> 2);
    px_config->words[iVar2] =
         (uint)bmc->px_config[local_34] << (('\x03' - (char)(iVar1 % 4)) * '\b' & 0x1fU) |
         px_config->words[iVar2];
  }
  return 0;
}

Assistant:

int
katherine_px_config_load_bmc_data(katherine_px_config_t *px_config, const katherine_bmc_t *bmc)
{
    // Reset the pixel values.
    memset(&px_config->words, 0, 65536);

    int x, y;
    uint32_t *dest = (uint32_t*) px_config->words;
    const unsigned char *src = (const unsigned char *) bmc->px_config;

    // Parse data from BMC format.
    for (int i = 0; i < 65536; ++i) {
        x = i % 256;
        y = 255 - i / 256;
        dest[(64 * x) + (y >> 2)] |= (uint32_t) (src[i] << (8 * (3 - (y % 4))));
    }

    return 0;
}